

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbvthandler.cpp
# Opt level: O2

void __thiscall QFbVtHandler::setKeyboardEnabled(QFbVtHandler *this,bool enable)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = *(int *)(this + 0x10);
  if (iVar1 == -1) {
    return;
  }
  if (enable) {
    ioctl(iVar1,0x4b51,0);
    iVar1 = *(int *)(this + 0x10);
    uVar2 = (ulong)*(uint *)(this + 0x14);
  }
  else {
    ioctl(iVar1,0x4b44,this + 0x14);
    iVar1 = qEnvironmentVariableIntValue("QT_QPA_ENABLE_TERMINAL_KEYBOARD",(bool *)0x0);
    if (iVar1 != 0) {
      return;
    }
    ioctl(*(int *)(this + 0x10),0x4b51,1);
    iVar1 = *(int *)(this + 0x10);
    uVar2 = 4;
  }
  ioctl(iVar1,0x4b45,uVar2);
  return;
}

Assistant:

void QFbVtHandler::setKeyboardEnabled(bool enable)
{
#ifdef VTH_ENABLED
    if (m_tty == -1)
        return;

    if (enable) {
        ::ioctl(m_tty, KDSKBMUTE, 0);
        ::ioctl(m_tty, KDSKBMODE, m_oldKbdMode);
    } else {
        ::ioctl(m_tty, KDGKBMODE, &m_oldKbdMode);
        if (!qEnvironmentVariableIntValue("QT_QPA_ENABLE_TERMINAL_KEYBOARD")) {
            ::ioctl(m_tty, KDSKBMUTE, 1);
            ::ioctl(m_tty, KDSKBMODE, KBD_OFF_MODE);
        }
    }
#else
    Q_UNUSED(enable);
#endif
}